

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ITracker * __thiscall
Catch::TestCaseTracking::TrackerBase::findChild(TrackerBase *this,string *name)

{
  __normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __last;
  __normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  _Var1;
  ITracker *pIVar2;
  string local_40 [32];
  
  _Var1._M_current =
       (this->m_children).
       super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->m_children).
       super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string(local_40,(string *)name);
  _Var1 = std::
          find_if<__gnu_cxx::__normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>*,std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>>>>,Catch::TestCaseTracking::TrackerBase::TrackerHasName>
                    (_Var1,__last,(TrackerHasName *)local_40);
  std::__cxx11::string::~string(local_40);
  if (_Var1._M_current ==
      (this->m_children).
      super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar2 = (ITracker *)0x0;
  }
  else {
    pIVar2 = (_Var1._M_current)->m_p;
  }
  return pIVar2;
}

Assistant:

virtual ITracker* findChild( std::string const& name ) CATCH_OVERRIDE {
            Children::const_iterator it = std::find_if( m_children.begin(), m_children.end(), TrackerHasName( name ) );
            return( it != m_children.end() )
                ? it->get()
                : CATCH_NULL;
        }